

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O2

void __thiscall
persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::compute_zeroth_persistence
          (persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           *this,unsigned_short min_dimension,unsigned_short param_2)

{
  pointer pfVar1;
  pointer pfVar2;
  pair<unsigned_short,_unsigned_short> pVar3;
  uint uVar4;
  uint uVar5;
  ostream *poVar6;
  pair<float,_int> *ppVar7;
  undefined6 in_register_00000032;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  float fVar12;
  filtration_index_t e;
  vector<filtration_index_t,_std::allocator<filtration_index_t>_> edges;
  filtered_union_find dset;
  float local_110;
  float local_10c;
  pair<float,_int> local_108;
  undefined4 local_fc;
  _Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_> local_f8;
  unsigned_long local_e0;
  deque<filtration_index_t,_std::allocator<filtration_index_t>_> *local_d8;
  pair<float,_int> *local_d0;
  pair<float,_int> *local_c8;
  filtered_union_find local_c0;
  _Deque_iterator<filtration_index_t,_filtration_index_t_&,_filtration_index_t_*> local_78;
  _Deque_iterator<filtration_index_t,_filtration_index_t_&,_filtration_index_t_*> local_58;
  
  directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
  prepare_next_dimension(this->complex,0);
  local_fc = (undefined4)CONCAT62(in_register_00000032,min_dimension);
  if (min_dimension < 2) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\x1b[K");
    std::operator<<(poVar6,"computing persistent homology in dimension 0");
    poVar6 = (ostream *)std::ostream::flush();
    std::operator<<(poVar6,"\r");
    local_e0 = *(this->complex->cell_count).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
    vertex_filtration((vector<float,_std::allocator<float>_> *)&local_f8,this->complex);
    filtered_union_find::filtered_union_find
              (&local_c0,(vector<float,_std::allocator<float>_> *)&local_f8);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&local_f8);
    local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar4 = (uint)(this->complex->cell_count).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[1];
    uVar9 = 0;
    uVar8 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar8 = uVar9;
    }
    for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      if (this->complex->filtration_algorithm == (filtration_algorithm_t *)0x0) {
        fVar12 = 0.0;
      }
      else {
        fVar12 = (this->complex->graph->edge_filtration).
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_start[uVar10];
      }
      if (fVar12 <= this->max_filtration) {
        local_108 = (pair<float,_int>)((uint)fVar12 + uVar9);
        std::vector<filtration_index_t,_std::allocator<filtration_index_t>_>::
        emplace_back<filtration_index_t>
                  ((vector<filtration_index_t,_std::allocator<filtration_index_t>_> *)&local_f8,
                   (filtration_index_t *)&local_108);
      }
      uVar9 = uVar9 + 0x100000000;
    }
    local_c8 = &(local_f8._M_impl.super__Vector_impl_data._M_finish)->super_pair<float,_int>;
    local_d0 = &(local_f8._M_impl.super__Vector_impl_data._M_start)->super_pair<float,_int>;
    std::
    sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<filtration_index_t*,std::vector<filtration_index_t,std::allocator<filtration_index_t>>>>,greater_filtration_or_smaller_index<filtration_index_t>>
              ();
    (*this->output->_vptr_output_t[5])(this->output,0);
    pfVar2 = local_f8._M_impl.super__Vector_impl_data._M_finish;
    local_d8 = &this->columns_to_reduce;
    for (ppVar7 = &(local_f8._M_impl.super__Vector_impl_data._M_start)->super_pair<float,_int>;
        ppVar7 != &pfVar2->super_pair<float,_int>; ppVar7 = ppVar7 + 1) {
      local_108 = *ppVar7;
      pVar3 = directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
              vertices_of_edge(this->complex,local_108.second);
      uVar4 = filtered_union_find::find(&local_c0,(uint)pVar3 & 0xffff);
      uVar5 = filtered_union_find::find(&local_c0,(uint)pVar3 >> 0x10);
      if (uVar4 == uVar5) {
        std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::push_back
                  (local_d8,(value_type *)&local_108);
      }
      else {
        if (this->complex->filtration_algorithm == (filtration_algorithm_t *)0x0) {
          local_110 = 0.0;
          local_10c = 0.0;
        }
        else {
          pfVar1 = (this->complex->graph->vertex_filtration).
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_start;
          local_10c = pfVar1[(int)uVar4];
          local_110 = pfVar1[(int)uVar5];
        }
        filtered_union_find::link(&local_c0,(char *)(ulong)uVar4,(char *)(ulong)uVar5);
        if ((short)local_fc == 0) {
          fVar12 = local_110;
          if (local_110 <= local_10c) {
            fVar12 = local_10c;
          }
          if (fVar12 < local_108.first) {
            uVar5 = filtered_union_find::find(&local_c0,uVar4);
            if (uVar5 != uVar4) {
              local_110 = local_10c;
            }
            (*this->output->_vptr_output_t[6])(local_110,local_108.first);
          }
        }
      }
    }
    local_58._M_cur =
         (this->columns_to_reduce).
         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur;
    local_58._M_first =
         (this->columns_to_reduce).
         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
         super__Deque_impl_data._M_start._M_first;
    local_58._M_last =
         (this->columns_to_reduce).
         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
         super__Deque_impl_data._M_start._M_last;
    local_58._M_node =
         (this->columns_to_reduce).
         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
         super__Deque_impl_data._M_start._M_node;
    local_78._M_cur =
         (this->columns_to_reduce).
         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur;
    local_78._M_first =
         (this->columns_to_reduce).
         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
         super__Deque_impl_data._M_finish._M_first;
    local_78._M_last =
         (this->columns_to_reduce).
         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
         super__Deque_impl_data._M_finish._M_last;
    local_78._M_node =
         (this->columns_to_reduce).
         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
         super__Deque_impl_data._M_finish._M_node;
    std::reverse<std::_Deque_iterator<filtration_index_t,filtration_index_t&,filtration_index_t*>>
              (&local_58,&local_78);
    if ((short)local_fc != 1) {
      uVar9 = 0;
      uVar8 = local_e0 & 0xffffffff;
      if ((int)local_e0 < 1) {
        uVar8 = uVar9;
      }
      lVar11 = 0;
      for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
        uVar4 = filtered_union_find::find(&local_c0,(index_t)uVar9);
        if (uVar9 == uVar4) {
          if (this->complex->filtration_algorithm == (filtration_algorithm_t *)0x0) {
            fVar12 = 0.0;
          }
          else {
            fVar12 = (this->complex->graph->vertex_filtration).
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9];
          }
          (*this->output->_vptr_output_t[7])(fVar12);
          lVar11 = lVar11 + 1;
        }
      }
      (*this->output->_vptr_output_t[9])(this->output,lVar11,0);
      if (this->print_betti_numbers_to_console == true) {
        poVar6 = std::operator<<((ostream *)&std::cout,"\x1b[K");
        poVar6 = std::operator<<(poVar6,"The dimensions of the mod-");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->modulus);
        poVar6 = std::operator<<(poVar6," homology of the full complex are:");
        poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
        poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
        poVar6 = std::operator<<(poVar6,"dim H_0 = ");
        poVar6 = std::ostream::_M_insert<long_long>((longlong)poVar6);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      this->euler_characteristic = this->euler_characteristic + (int)lVar11;
    }
    std::_Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>::~_Vector_base
              (&local_f8);
    filtered_union_find::~filtered_union_find(&local_c0);
  }
  return;
}

Assistant:

void compute_zeroth_persistence(unsigned short min_dimension, unsigned short) {
		complex.prepare_next_dimension(0);

		// Only compute this if we actually need it
		if (min_dimension > 1) return;

#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "computing persistent homology in dimension 0" << std::flush << "\r";
#endif

		long long betti_number = 0;
#ifdef RETRIEVE_PERSISTENCE
		std::vector<std::pair<value_t, value_t>> birth_death;
#endif
		size_t n = complex.number_of_cells(0);
		filtered_union_find dset(complex.vertex_filtration());
		std::vector<filtration_index_t> edges;
		index_t number_of_edges = index_t(complex.number_of_cells(1));
		for (index_t index = 0; index < number_of_edges; index++) {
			value_t filtration = complex.filtration(1, index);
			if (filtration <= max_filtration) edges.push_back(std::make_pair(filtration, index));
		}
		std_algorithms::sort(edges.rbegin(), edges.rend(), greater_filtration_or_smaller_index<filtration_index_t>());

		// Let the output class know that we are now computing zeroth degree barcodes
		output->computing_barcodes_in_dimension(0);

		for (auto e : edges) {
			const auto vertices = complex.vertices_of_edge(get_index(e));
			index_t u = dset.find(vertices.first), v = dset.find(vertices.second);

			if (u != v) {
				// Only output bars if we are interested in zeroth homology
				const auto filtration_u = complex.filtration(0, u);
				const auto filtration_v = complex.filtration(0, v);
				dset.link(u, v);
				if (min_dimension == 0 && get_filtration(e) > std::max(filtration_u, filtration_v)) {
					// Check which vertex is merged into which other vertex.
					const auto f = dset.find(u) == u ? filtration_v : filtration_u;
					output->new_barcode(f, get_filtration(e));
#ifdef RETRIEVE_PERSISTENCE
					birth_death.push_back(std::make_pair(f, get_filtration(e)));
#endif
				}
			} else {
				columns_to_reduce.push_back(e);
			}
		}
		std::reverse(columns_to_reduce.begin(), columns_to_reduce.end());

		// If we don't care about zeroth homology, then we can stop here
		if (min_dimension == 1) return;

		for (index_t index = 0; index < index_t(n); ++index) {
			if (dset.find(index) == index) {
				output->new_infinite_barcode(complex.filtration(0, index));
				betti_number++;
#ifdef RETRIEVE_PERSISTENCE
				birth_death.push_back(
				    std::make_pair(complex.filtration(0, index), std::numeric_limits<value_t>::infinity()));
#endif
			}
		}

#ifdef RETRIEVE_PERSISTENCE
		betti_numbers.push_back(betti_number);
		birth_deaths_by_dim.push_back(birth_death);
#endif
		// Report the betti number back to the complex and the output
		complex.computation_result(0, betti_number, 0);
		output->betti_number(betti_number, 0);

		if (print_betti_numbers_to_console) {
			std::cout << "\033[K"
			          << "The dimensions of the mod-" << modulus << " homology of the full complex are:" << std::endl
			          << std::endl
			          << "dim H_0 = " << betti_number << std::endl;
		}
		euler_characteristic += index_t(betti_number);
	}